

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkValidate.cpp
# Opt level: O3

void __thiscall glslang::TIntermediate::inOutLocationCheck(TIntermediate *this,TInfoSink *infoSink)

{
  byte bVar1;
  int iVar2;
  TIntermAggregate *pTVar3;
  undefined4 extraout_var;
  long *plVar5;
  long lVar6;
  ulong uVar7;
  long lVar4;
  
  pTVar3 = findLinkerObjects(this);
  iVar2 = (*(pTVar3->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
            [0x32])(pTVar3);
  lVar4 = CONCAT44(extraout_var,iVar2);
  lVar6 = *(long *)(lVar4 + 8);
  if (*(long *)(lVar4 + 0x10) != lVar6) {
    bVar1 = 0;
    iVar2 = 0;
    uVar7 = 0;
    do {
      plVar5 = (long *)(**(code **)(**(long **)(lVar6 + uVar7 * 8) + 0x18))();
      plVar5 = (long *)(**(code **)(*plVar5 + 0xf0))(plVar5);
      lVar6 = (**(code **)(*plVar5 + 0x58))(plVar5);
      if ((this->language == EShLangFragment) && (*(short *)(lVar6 + 8) == 4)) {
        iVar2 = iVar2 + 1;
        bVar1 = bVar1 | (*(ulong *)(lVar6 + 0x1c) & 0xff000000007fff) == 0xff000000004fff;
      }
      uVar7 = uVar7 + 1;
      lVar6 = *(long *)(lVar4 + 8);
    } while (uVar7 < (ulong)(*(long *)(lVar4 + 0x10) - lVar6 >> 3));
    if ((bool)((this->profile == EEsProfile && 1 < iVar2) & bVar1)) {
      error(this,infoSink,
            "when more than one fragment shader output, all must have location qualifiers",
            EShLangCount);
      return;
    }
  }
  return;
}

Assistant:

void TIntermediate::inOutLocationCheck(TInfoSink& infoSink)
{
    // ES 3.0 requires all outputs to have location qualifiers if there is more than one output
    bool fragOutWithNoLocation = false;
    int numFragOut = 0;

    // TODO: linker functionality: location collision checking

    TIntermSequence& linkObjects = findLinkerObjects()->getSequence();
    for (size_t i = 0; i < linkObjects.size(); ++i) {
        const TType& type = linkObjects[i]->getAsTyped()->getType();
        const TQualifier& qualifier = type.getQualifier();
        if (language == EShLangFragment) {
            if (qualifier.storage == EvqVaryingOut && qualifier.builtIn == EbvNone) {
                ++numFragOut;
                if (!qualifier.hasAnyLocation())
                    fragOutWithNoLocation = true;
            }
        }
    }

    if (isEsProfile()) {
        if (numFragOut > 1 && fragOutWithNoLocation)
            error(infoSink, "when more than one fragment shader output, all must have location qualifiers");
    }
}